

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImVec2 *pIVar1;
  ImGuiTabItem *pIVar2;
  ImGuiID *pIVar3;
  int *piVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  ImGuiID IVar8;
  ImGuiShrinkWidthItem *pIVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImGuiID IVar14;
  ImGuiID IVar15;
  ImGuiID IVar16;
  ImGuiContext *pIVar17;
  ImGuiContext *pIVar18;
  bool bVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  char *__dest;
  ulong uVar23;
  char *pcVar24;
  ulong uVar25;
  ImGuiWindow *pIVar26;
  ulong uVar27;
  uint uVar28;
  ImGuiTabItem *pIVar29;
  ImGuiTabItem *pIVar30;
  ImGuiTabItem *pIVar31;
  ImGuiWindow *pIVar32;
  float *pfVar33;
  long lVar34;
  ImGuiWindow *unaff_R14;
  size_t size;
  uint uVar35;
  int iVar36;
  float *pfVar37;
  bool bVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  ImVec2 IVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  ImGuiTabItem item_tmp;
  ImVec4 local_78;
  ImVec2 local_68;
  undefined8 local_60;
  char *local_58;
  float fStack_50;
  float fStack_4c;
  ImVec2 local_48;
  ImVec2 IStack_40;
  
  pIVar18 = GImGui;
  tab_bar->WantLayout = false;
  uVar35 = (tab_bar->Tabs).Size;
  uVar25 = (ulong)uVar35;
  if ((int)uVar35 < 1) {
    uVar28 = 0;
  }
  else {
    lVar22 = 0;
    uVar23 = 0;
    uVar28 = 0;
    do {
      pIVar29 = (tab_bar->Tabs).Data;
      pIVar3 = (ImGuiID *)((long)&pIVar29->ID + lVar22);
      if (*(int *)((long)&pIVar29->LastFrameVisible + lVar22) < tab_bar->PrevFrameVisible) {
        if (*pIVar3 == tab_bar->SelectedTabId) {
          tab_bar->SelectedTabId = 0;
        }
      }
      else {
        if (uVar23 != uVar28) {
          if ((int)uVar25 <= (int)uVar28) goto LAB_00170071;
          IVar8 = pIVar3[0];
          IVar14 = pIVar3[1];
          IVar15 = pIVar3[2];
          IVar16 = pIVar3[3];
          fVar44 = (float)pIVar3[5];
          fVar45 = (float)pIVar3[6];
          fVar43 = (float)pIVar3[7];
          piVar4 = &pIVar29[(int)uVar28].NameOffset;
          *piVar4 = pIVar3[4];
          piVar4[1] = (int)fVar44;
          piVar4[2] = (int)fVar45;
          piVar4[3] = (int)fVar43;
          pIVar29 = pIVar29 + (int)uVar28;
          pIVar29->ID = IVar8;
          pIVar29->Flags = IVar14;
          pIVar29->LastFrameVisible = IVar15;
          pIVar29->LastFrameSelected = IVar16;
        }
        uVar28 = uVar28 + 1;
      }
      uVar23 = uVar23 + 1;
      uVar35 = (tab_bar->Tabs).Size;
      uVar25 = (ulong)(int)uVar35;
      lVar22 = lVar22 + 0x20;
    } while ((long)uVar23 < (long)uVar25);
  }
  if (uVar35 != uVar28) {
    iVar20 = (tab_bar->Tabs).Capacity;
    if (iVar20 < (int)uVar28) {
      if (iVar20 == 0) {
        uVar35 = 8;
      }
      else {
        uVar35 = iVar20 / 2 + iVar20;
      }
      if ((int)uVar35 <= (int)uVar28) {
        uVar35 = uVar28;
      }
      if (iVar20 < (int)uVar35) {
        unaff_R14 = (ImGuiWindow *)MemAlloc((long)(int)uVar35 << 5);
        pIVar29 = (tab_bar->Tabs).Data;
        if (pIVar29 != (ImGuiTabItem *)0x0) {
          memcpy(unaff_R14,pIVar29,(long)(tab_bar->Tabs).Size << 5);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = (ImGuiTabItem *)unaff_R14;
        (tab_bar->Tabs).Capacity = uVar35;
      }
    }
    (tab_bar->Tabs).Size = uVar28;
  }
  fVar44 = (float)tab_bar->NextSelectedTabId;
  if (fVar44 == 0.0) {
    fVar44 = 0.0;
  }
  else {
    tab_bar->SelectedTabId = (ImGuiID)fVar44;
    tab_bar->NextSelectedTabId = 0;
  }
  fVar45 = (float)tab_bar->ReorderRequestTabId;
  if (fVar45 != 0.0) {
    uVar25 = (ulong)(tab_bar->Tabs).Size;
    bVar38 = 0 < (long)uVar25;
    if (0 < (long)uVar25) {
      unaff_R14 = (ImGuiWindow *)(tab_bar->Tabs).Data;
      bVar38 = true;
      if (*(float *)&unaff_R14->Name != fVar45) {
        pIVar26 = (ImGuiWindow *)((long)unaff_R14 + uVar25 * 0x20 + -0x20);
        uVar23 = 1;
        pIVar32 = unaff_R14;
        do {
          uVar27 = uVar23;
          unaff_R14 = pIVar26;
          if (uVar25 == uVar27) break;
          unaff_R14 = (ImGuiWindow *)&pIVar32->SizeFull;
          pIVar1 = &pIVar32->SizeFull;
          uVar23 = uVar27 + 1;
          pIVar32 = unaff_R14;
        } while (pIVar1->x != fVar45);
        bVar38 = uVar27 < uVar25;
      }
    }
    if ((bVar38) && (unaff_R14 != (ImGuiWindow *)0x0)) {
      iVar20 = ImGuiTabBar::GetTabOrder(tab_bar,(ImGuiTabItem *)unaff_R14);
      uVar35 = tab_bar->ReorderRequestDir + iVar20;
      if ((-1 < (int)uVar35) && ((int)uVar35 < (tab_bar->Tabs).Size)) {
        pIVar30 = (tab_bar->Tabs).Data;
        local_58 = unaff_R14->Name;
        fStack_50 = (float)unaff_R14->ID;
        fStack_4c = (float)unaff_R14->Flags;
        local_48 = unaff_R14->Pos;
        IStack_40 = unaff_R14->Size;
        pIVar29 = pIVar30 + uVar35;
        pcVar24 = *(char **)pIVar29;
        iVar20 = pIVar29->LastFrameVisible;
        iVar21 = pIVar29->LastFrameSelected;
        pIVar29 = pIVar30 + uVar35;
        fVar45 = pIVar29->Offset;
        IVar42 = *(ImVec2 *)(&pIVar29->NameOffset + 2);
        (unaff_R14->Pos).x = (float)pIVar29->NameOffset;
        (unaff_R14->Pos).y = fVar45;
        unaff_R14->Size = IVar42;
        unaff_R14->Name = pcVar24;
        unaff_R14->ID = iVar20;
        unaff_R14->Flags = iVar21;
        pIVar29 = pIVar30 + uVar35;
        pIVar29->ID = (ImGuiID)SUB84(local_58,0);
        pIVar29->Flags = (ImGuiTabItemFlags)SUB84(local_58,4);
        pIVar29->LastFrameVisible = (int)fStack_50;
        pIVar29->LastFrameSelected = (int)fStack_4c;
        pIVar29 = pIVar30 + uVar35;
        pIVar29->NameOffset = (int)local_48.x;
        pIVar29->Offset = local_48.y;
        *(ImVec2 *)(&pIVar29->NameOffset + 2) = IStack_40;
        if (pIVar30[uVar35].ID == tab_bar->SelectedTabId) {
          fVar44 = (float)pIVar30[uVar35].ID;
        }
      }
      if ((tab_bar->Flags & 0x400000) != 0) {
        MarkIniSettingsDirty();
      }
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar17 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    unaff_R14 = GImGui->CurrentWindow;
    fVar45 = (GImGui->Style).FramePadding.y;
    fVar43 = GImGui->FontSize;
    IVar42 = (unaff_R14->DC).CursorPos;
    fVar41 = (tab_bar->BarRect).Min.y;
    (unaff_R14->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar45;
    (unaff_R14->DC).CursorPos.y = fVar41;
    (tab_bar->BarRect).Min.x = fVar43 + fVar45 + (tab_bar->BarRect).Min.x;
    local_58._0_4_ = (pIVar17->Style).Colors[0].x;
    local_58._4_4_ = (pIVar17->Style).Colors[0].y;
    uVar10 = (pIVar17->Style).Colors[0].z;
    uVar11 = (pIVar17->Style).Colors[0].w;
    fStack_4c = (float)uVar11 * 0.5;
    fStack_50 = (float)uVar10;
    pfVar37 = (float *)0x0;
    PushStyleColor(0,(ImVec4 *)&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    bVar38 = BeginCombo("##v",(char *)0x0,0x40);
    PopStyleColor(2);
    if (bVar38) {
      if ((tab_bar->Tabs).Size < 1) {
        pfVar37 = (float *)0x0;
      }
      else {
        lVar34 = 0;
        lVar22 = 0;
        pfVar37 = (float *)0x0;
        do {
          pIVar29 = (tab_bar->Tabs).Data;
          iVar20 = *(int *)((long)&pIVar29->NameOffset + lVar34);
          if (((long)iVar20 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar20)) goto LAB_0016fffd;
          pfVar33 = (float *)((long)&pIVar29->ID + lVar34);
          local_78.x = 0.0;
          local_78.y = 0.0;
          bVar38 = Selectable((tab_bar->TabsNames).Buf.Data + iVar20,
                              (float)tab_bar->SelectedTabId == *pfVar33,0,(ImVec2 *)&local_78);
          if (bVar38) {
            pfVar37 = pfVar33;
          }
          lVar22 = lVar22 + 1;
          lVar34 = lVar34 + 0x20;
        } while (lVar22 < (tab_bar->Tabs).Size);
      }
      EndPopup();
    }
    (unaff_R14->DC).CursorPos = IVar42;
    if (pfVar37 != (float *)0x0) {
      fVar44 = *pfVar37;
      tab_bar->SelectedTabId = (ImGuiID)fVar44;
    }
  }
  iVar20 = (tab_bar->Tabs).Size;
  iVar21 = (pIVar18->ShrinkWidthBuffer).Capacity;
  if (iVar21 < iVar20) {
    if (iVar21 == 0) {
      iVar36 = 8;
    }
    else {
      iVar36 = iVar21 / 2 + iVar21;
    }
    if (iVar36 <= iVar20) {
      iVar36 = iVar20;
    }
    if (iVar21 < iVar36) {
      unaff_R14 = (ImGuiWindow *)MemAlloc((long)iVar36 << 3);
      pIVar9 = (pIVar18->ShrinkWidthBuffer).Data;
      if (pIVar9 != (ImGuiShrinkWidthItem *)0x0) {
        memcpy(unaff_R14,pIVar9,(long)(pIVar18->ShrinkWidthBuffer).Size << 3);
        MemFree((pIVar18->ShrinkWidthBuffer).Data);
      }
      (pIVar18->ShrinkWidthBuffer).Data = (ImGuiShrinkWidthItem *)unaff_R14;
      (pIVar18->ShrinkWidthBuffer).Capacity = iVar36;
    }
  }
  (pIVar18->ShrinkWidthBuffer).Size = iVar20;
  uVar35 = (tab_bar->Tabs).Size;
  if ((int)uVar35 < 1) {
    bVar38 = true;
    pIVar32 = (ImGuiWindow *)0x0;
    fVar45 = 0.0;
  }
  else {
    fVar45 = 0.0;
    lVar22 = 0;
    lVar34 = 0;
    pIVar32 = (ImGuiWindow *)0x0;
    bVar38 = false;
    do {
      unaff_R14 = (ImGuiWindow *)(tab_bar->Tabs).Data;
      if (*(int *)((long)&unaff_R14->ID + lVar22) < tab_bar->PrevFrameVisible) {
        __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                      ,0x1a57,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      if ((pIVar32 == (ImGuiWindow *)0x0) ||
         (pIVar32->Flags < *(int *)((long)&unaff_R14->Flags + lVar22))) {
        pIVar32 = (ImGuiWindow *)((long)&unaff_R14->Name + lVar22);
      }
      if (*(ImGuiID *)((long)&unaff_R14->Name + lVar22) == tab_bar->SelectedTabId) {
        bVar38 = true;
      }
      iVar20 = *(int *)((long)&(unaff_R14->Pos).x + lVar22);
      if (((long)iVar20 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar20)) {
LAB_0016fffd:
        __assert_fail("tab->NameOffset != -1 && tab->NameOffset < TabsNames.Buf.Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_internal.h"
                      ,0x6c8,"const char *ImGuiTabBar::GetTabName(const ImGuiTabItem *) const");
      }
      IVar42 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data + iVar20,
                               (*(uint *)((long)&unaff_R14->Name + lVar22 + 4) >> 0x14 & 1) == 0);
      fVar43 = IVar42.x;
      *(float *)((long)&(unaff_R14->Size).y + lVar22) = fVar43;
      if (lVar34 == 0) {
        fVar41 = 0.0;
      }
      else {
        fVar41 = (pIVar18->Style).ItemInnerSpacing.x;
      }
      if ((pIVar18->ShrinkWidthBuffer).Size <= lVar34) goto LAB_0017001c;
      fVar45 = fVar45 + fVar41 + fVar43;
      pIVar9 = (pIVar18->ShrinkWidthBuffer).Data;
      pIVar9[lVar34].Index = (int)lVar34;
      pIVar9[lVar34].Width = fVar43;
      lVar34 = lVar34 + 1;
      uVar35 = (tab_bar->Tabs).Size;
      lVar22 = lVar22 + 0x20;
    } while (lVar34 < (int)uVar35);
    bVar38 = !bVar38;
  }
  fVar43 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar43 = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
  fVar45 = (float)(-(uint)(fVar43 < fVar45) & (uint)(fVar45 - fVar43));
  if ((fVar45 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    if (0 < (int)uVar35) {
      fVar45 = GImGui->FontSize * 20.0;
      pIVar29 = (tab_bar->Tabs).Data;
      lVar22 = 0;
      do {
        fVar43 = *(float *)((long)&pIVar29->ContentWidth + lVar22);
        if (fVar45 <= fVar43) {
          fVar43 = fVar45;
        }
        *(float *)((long)&pIVar29->Width + lVar22) = fVar43;
        if (fVar43 <= 0.0) {
          __assert_fail("tab->Width > 0.0f",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                        ,0x1a7e,"void ImGui::TabBarLayout(ImGuiTabBar *)");
        }
        lVar22 = lVar22 + 0x20;
      } while ((ulong)uVar35 << 5 != lVar22);
    }
  }
  else {
    ShrinkWidths((pIVar18->ShrinkWidthBuffer).Data,(pIVar18->ShrinkWidthBuffer).Size,fVar45);
    iVar20 = (tab_bar->Tabs).Size;
    unaff_R14 = pIVar32;
    if (0 < (long)iVar20) {
      uVar35 = (pIVar18->ShrinkWidthBuffer).Size;
      uVar23 = 0;
      uVar25 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar25 = uVar23;
      }
      do {
        if (uVar25 == uVar23) goto LAB_0017001c;
        pIVar9 = (pIVar18->ShrinkWidthBuffer).Data;
        iVar21 = pIVar9[uVar23].Index;
        if (iVar20 <= iVar21) goto LAB_00170071;
        (tab_bar->Tabs).Data[iVar21].Width = (float)(int)pIVar9[uVar23].Width;
        uVar23 = uVar23 + 1;
      } while ((long)iVar20 != uVar23);
    }
  }
  tab_bar->OffsetNextTab = 0.0;
  iVar20 = (tab_bar->Tabs).Size;
  if ((long)iVar20 < 1) {
    fVar45 = 0.0;
    fVar43 = 0.0;
  }
  else {
    pIVar29 = (tab_bar->Tabs).Data;
    fVar41 = (pIVar18->Style).ItemInnerSpacing.x;
    fVar45 = 0.0;
    fVar43 = 0.0;
    lVar22 = 0;
    do {
      *(float *)((long)&pIVar29->Offset + lVar22) = fVar45;
      if ((fVar44 == 0.0) &&
         (fVar44 = *(float *)((long)&pIVar29->ID + lVar22),
         (float)pIVar18->NavJustMovedToId != fVar44)) {
        fVar44 = 0.0;
      }
      uVar6 = *(undefined8 *)((long)&pIVar29->Width + lVar22);
      fVar45 = fVar45 + (float)uVar6 + fVar41;
      fVar43 = fVar43 + (float)((ulong)uVar6 >> 0x20) + fVar41;
      lVar22 = lVar22 + 0x20;
    } while ((long)iVar20 << 5 != lVar22);
  }
  fVar41 = (pIVar18->Style).ItemInnerSpacing.x;
  fVar45 = fVar45 - fVar41;
  fVar43 = fVar43 - fVar41;
  fVar45 = (float)(-(uint)(0.0 <= fVar45) & (uint)fVar45);
  tab_bar->OffsetMax = fVar45;
  pIVar17 = GImGui;
  tab_bar->OffsetMaxIdeal = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
  if (((1 < iVar20) &&
      (fVar43 = (tab_bar->BarRect).Min.x, (tab_bar->BarRect).Max.x - fVar43 < fVar45)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar26 = GImGui->CurrentWindow;
    fVar48 = GImGui->FontSize + -2.0;
    fVar45 = (GImGui->Style).FramePadding.y;
    fVar40 = fVar48 + fVar48;
    fVar41 = (tab_bar->BarRect).Max.x;
    fVar49 = (pIVar26->DC).CursorPos.x;
    bVar39 = false;
    if (((fVar43 <= fVar49) &&
        (fVar43 = (pIVar26->DC).CursorPos.y, bVar39 = false, (tab_bar->BarRect).Min.y <= fVar43)) &&
       (fVar49 + fVar40 <= fVar41)) {
      bVar39 = fVar43 <= (tab_bar->BarRect).Max.y;
    }
    IVar42.y = fVar45 + fVar45 + GImGui->FontSize;
    IVar42.x = fVar48;
    local_68 = (pIVar26->DC).CursorPos;
    if (!bVar39) {
      local_58._4_4_ = (tab_bar->BarRect).Max.y + 0.0;
      local_58._0_4_ = (GImGui->Style).ItemInnerSpacing.x + fVar41;
      PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&local_58,true);
    }
    local_58._0_4_ = (pIVar17->Style).Colors[0].x;
    local_58._4_4_ = (pIVar17->Style).Colors[0].y;
    uVar12 = (pIVar17->Style).Colors[0].z;
    uVar13 = (pIVar17->Style).Colors[0].w;
    fStack_4c = (float)uVar13 * 0.5;
    fStack_50 = (float)uVar12;
    PushStyleColor(0,(ImVec4 *)&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    local_60._0_4_ = (pIVar17->IO).KeyRepeatDelay;
    local_60._4_4_ = (pIVar17->IO).KeyRepeatRate;
    (pIVar17->IO).KeyRepeatDelay = 0.25;
    (pIVar17->IO).KeyRepeatRate = 0.2;
    fVar45 = (tab_bar->BarRect).Min.y;
    (pIVar26->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar40;
    (pIVar26->DC).CursorPos.y = fVar45;
    bVar19 = ArrowButtonEx("##<",0,IVar42,3);
    iVar20 = -(uint)bVar19;
    fVar45 = (tab_bar->BarRect).Min.y;
    (pIVar26->DC).CursorPos.x = fVar48 + ((tab_bar->BarRect).Max.x - fVar40);
    (pIVar26->DC).CursorPos.y = fVar45;
    unaff_R14 = (ImGuiWindow *)0x1;
    pIVar29 = (ImGuiTabItem *)0x1;
    bVar19 = ArrowButtonEx("##>",1,IVar42,3);
    if (bVar19) {
      iVar20 = 1;
    }
    PopStyleColor(2);
    (pIVar17->IO).KeyRepeatDelay = (float)(undefined4)local_60;
    (pIVar17->IO).KeyRepeatRate = (float)local_60._4_4_;
    if (!bVar39) {
      PopClipRect();
    }
    if (iVar20 == 0) {
      pIVar29 = (ImGuiTabItem *)0x0;
    }
    else {
      IVar8 = tab_bar->SelectedTabId;
      if (IVar8 == 0) {
LAB_0016fcbe:
        pIVar29 = (ImGuiTabItem *)0x0;
      }
      else {
        uVar25 = (ulong)(tab_bar->Tabs).Size;
        bVar39 = 0 < (long)uVar25;
        if (0 < (long)uVar25) {
          pIVar29 = (tab_bar->Tabs).Data;
          bVar39 = true;
          if (pIVar29->ID != IVar8) {
            pIVar31 = pIVar29 + (uVar25 - 1);
            uVar23 = 0;
            pIVar30 = pIVar29;
            do {
              uVar27 = uVar25;
              pIVar29 = pIVar31;
              if (uVar25 - 1 == uVar23) break;
              pIVar29 = pIVar30 + 1;
              uVar27 = uVar23 + 1;
              pIVar2 = pIVar30 + 1;
              uVar23 = uVar27;
              pIVar30 = pIVar29;
            } while (pIVar2->ID != IVar8);
            bVar39 = uVar27 < uVar25;
          }
        }
        if (!bVar39) goto LAB_0016fcbe;
      }
      if (pIVar29 == (ImGuiTabItem *)0x0) {
        pIVar29 = (ImGuiTabItem *)0x0;
      }
      else {
        iVar21 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar29);
        iVar20 = iVar20 + iVar21;
        if ((iVar20 < 0) || ((tab_bar->Tabs).Size <= iVar20)) {
          iVar20 = iVar21;
        }
        if ((tab_bar->Tabs).Size <= iVar20) {
LAB_00170071:
          pcVar24 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
LAB_00170086:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                        ,0x52e,pcVar24);
        }
        pIVar29 = (tab_bar->Tabs).Data + iVar20;
      }
    }
    (pIVar26->DC).CursorPos = local_68;
    (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - (fVar40 + 1.0);
    if (pIVar29 != (ImGuiTabItem *)0x0) {
      fVar44 = (float)pIVar29->ID;
      tab_bar->SelectedTabId = (ImGuiID)fVar44;
    }
  }
  if (bVar38) {
    tab_bar->SelectedTabId = 0;
  }
  if (((tab_bar->SelectedTabId == 0) && (tab_bar->NextSelectedTabId == 0)) &&
     (pIVar32 != (ImGuiWindow *)0x0)) {
    fVar44 = *(float *)&pIVar32->Name;
    tab_bar->SelectedTabId = (ImGuiID)fVar44;
  }
  tab_bar->VisibleTabId = tab_bar->SelectedTabId;
  tab_bar->VisibleTabWasSubmitted = false;
  if (fVar44 != 0.0) {
    uVar25 = (ulong)(tab_bar->Tabs).Size;
    bVar38 = 0 < (long)uVar25;
    if (0 < (long)uVar25) {
      unaff_R14 = (ImGuiWindow *)(tab_bar->Tabs).Data;
      bVar38 = true;
      if (*(float *)&unaff_R14->Name != fVar44) {
        pIVar26 = (ImGuiWindow *)((long)unaff_R14 + uVar25 * 0x20 + -0x20);
        uVar23 = 1;
        pIVar32 = unaff_R14;
        do {
          uVar27 = uVar23;
          unaff_R14 = pIVar26;
          if (uVar25 == uVar27) break;
          unaff_R14 = (ImGuiWindow *)&pIVar32->SizeFull;
          pIVar1 = &pIVar32->SizeFull;
          uVar23 = uVar27 + 1;
          pIVar32 = unaff_R14;
        } while (pIVar1->x != fVar44);
        bVar38 = uVar27 < uVar25;
      }
    }
    if ((bVar38) && (unaff_R14 != (ImGuiWindow *)0x0)) {
      fVar44 = GImGui->FontSize;
      iVar20 = ImGuiTabBar::GetTabOrder(tab_bar,(ImGuiTabItem *)unaff_R14);
      fVar45 = (unaff_R14->Pos).y;
      fVar43 = fVar44;
      if (iVar20 < 1) {
        fVar43 = -0.0;
      }
      fVar43 = fVar45 - fVar43;
      if ((tab_bar->Tabs).Size <= iVar20 + 1) {
        fVar44 = 1.0;
      }
      fVar44 = fVar45 + (unaff_R14->Size).x + fVar44;
      tab_bar->ScrollingTargetDistToVisibility = 0.0;
      if ((fVar43 < tab_bar->ScrollingTarget) ||
         (fVar45 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x, fVar45 <= fVar44 - fVar43))
      {
        fVar41 = tab_bar->ScrollingAnim - fVar44;
      }
      else {
        if (fVar44 - fVar45 <= tab_bar->ScrollingTarget) goto LAB_0016fe8f;
        fVar41 = (fVar43 - fVar45) - tab_bar->ScrollingAnim;
        fVar43 = fVar44 - fVar45;
      }
      tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
      tab_bar->ScrollingTarget = fVar43;
    }
  }
LAB_0016fe8f:
  fVar44 = tab_bar->OffsetMax - ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x);
  uVar5 = tab_bar->ScrollingAnim;
  uVar7 = tab_bar->ScrollingTarget;
  auVar46._4_4_ = uVar7;
  auVar46._0_4_ = uVar5;
  auVar46._8_8_ = 0;
  auVar47._4_4_ = fVar44;
  auVar47._0_4_ = fVar44;
  auVar47._8_4_ = fVar44;
  auVar47._12_4_ = fVar44;
  auVar47 = minps(auVar46,auVar47);
  fVar44 = (float)(-(uint)(0.0 <= auVar47._0_4_) & (uint)auVar47._0_4_);
  fVar45 = (float)(-(uint)(0.0 <= auVar47._4_4_) & (uint)auVar47._4_4_);
  tab_bar->ScrollingAnim = fVar44;
  tab_bar->ScrollingTarget = fVar45;
  if ((fVar44 != fVar45) || (NAN(fVar44) || NAN(fVar45))) {
    fVar43 = pIVar18->FontSize;
    fVar41 = fVar43 * 70.0;
    uVar35 = -(uint)(fVar41 <= tab_bar->ScrollingSpeed);
    fVar49 = ABS(fVar45 - fVar44) / 0.3;
    fVar41 = (float)(~uVar35 & (uint)fVar41 | (uint)tab_bar->ScrollingSpeed & uVar35);
    uVar35 = -(uint)(fVar49 <= fVar41);
    fVar49 = (float)(~uVar35 & (uint)fVar49 | uVar35 & (uint)fVar41);
    tab_bar->ScrollingSpeed = fVar49;
    fVar41 = fVar45;
    if ((pIVar18->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar43 * 10.0)) {
      fVar49 = fVar49 * (pIVar18->IO).DeltaTime;
      if (fVar45 <= fVar44) {
        fVar41 = fVar44;
        if (fVar45 < fVar44) {
          fVar44 = fVar44 - fVar49;
          uVar35 = -(uint)(fVar45 <= fVar44);
          fVar41 = (float)((uint)fVar44 & uVar35 | ~uVar35 & (uint)fVar45);
        }
      }
      else {
        fVar41 = fVar44 + fVar49;
        if (fVar45 <= fVar41) {
          fVar41 = fVar45;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar41;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  if ((tab_bar->Flags & 0x100000) == 0) {
    iVar20 = (tab_bar->TabsNames).Buf.Capacity;
    if (iVar20 < 0) {
      uVar35 = iVar20 / 2 + iVar20;
      size = 0;
      if (0 < (int)uVar35) {
        size = (size_t)uVar35;
      }
      __dest = (char *)MemAlloc(size);
      pcVar24 = (tab_bar->TabsNames).Buf.Data;
      if (pcVar24 != (char *)0x0) {
        memcpy(__dest,pcVar24,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest;
      (tab_bar->TabsNames).Buf.Capacity = (int)size;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  return;
LAB_0017001c:
  pcVar24 = "T &ImVector<ImGuiShrinkWidthItem>::operator[](int) [T = ImGuiShrinkWidthItem]";
  goto LAB_00170086;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Compute ideal widths
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->ContentWidth;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        g.ShrinkWidthBuffer[tab_n].Index = tab_n;
        g.ShrinkWidthBuffer[tab_n].Width = tab->ContentWidth;
    }

    // Compute width
    const float initial_offset_x = 0.0f; // g.Style.ItemInnerSpacing.x;
    const float width_avail = ImMax(tab_bar->BarRect.GetWidth() - initial_offset_x, 0.0f);
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index].Width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->ContentWidth, tab_max_width);
            IM_ASSERT(tab->Width > 0.0f);
        }
    }

    // Layout all active tabs
    float offset_x = initial_offset_x;
    float offset_x_ideal = offset_x;
    tab_bar->OffsetNextTab = offset_x; // This is used by non-reorderable tab bar where the submission order is always honored.
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
        offset_x_ideal += tab->ContentWidth + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetMaxIdeal = ImMax(offset_x_ideal - g.Style.ItemInnerSpacing.x, 0.0f);

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);
}